

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

tensor * ad(tensor *a,double q)

{
  initializer_list<tensor_*> __l;
  int iVar1;
  add *this;
  undefined4 extraout_var;
  allocator<tensor_*> local_61;
  tensor *local_60;
  iterator local_58;
  size_type local_50;
  vector<tensor_*,_std::allocator<tensor_*>_> local_48;
  add *local_20;
  node *op;
  double q_local;
  tensor *a_local;
  
  op = (node *)q;
  q_local = (double)a;
  this = (add *)operator_new(0x48);
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_node)._vptr_node = (_func_int **)0x0;
  (this->super_node).ret = (tensor *)0x0;
  *(undefined8 *)&(this->super_node).isbuild = 0;
  add::add(this);
  local_60 = (tensor *)q_local;
  local_58 = &local_60;
  local_50 = 1;
  local_20 = this;
  std::allocator<tensor_*>::allocator(&local_61);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_48,__l,&local_61);
  iVar1 = (*(this->super_node)._vptr_node[1])((int)op,this,&local_48);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::~vector(&local_48);
  std::allocator<tensor_*>::~allocator(&local_61);
  return (tensor *)CONCAT44(extraout_var,iVar1);
}

Assistant:

tensor* ad(tensor *a, double q){
    node *op = new add();
    return op->forward({a},q);
}